

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O1

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateEndStructMethod
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  IdlNamer *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> returns;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> field_vec;
  string name;
  string local_c8;
  string local_a8;
  _Any_data local_88;
  _Manager_type local_78;
  code *pcStack_70;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_68;
  string local_50;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"end","");
  this_00 = &this->namer_;
  Namer::Method(&local_50,&this_00->super_Namer,&local_c8,(string *)struct_def);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  (*(this_00->super_Namer)._vptr_Namer[0xf])(&local_88,this_00,struct_def);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x36df7a);
  paVar1 = &local_a8.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_a8.field_2._M_allocated_capacity = *psVar3;
    local_a8.field_2._8_8_ = plVar2[3];
    local_a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar3;
    local_a8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_a8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_a8,local_a8._M_string_length,0,'\x01');
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_c8.field_2._M_allocated_capacity = *psVar3;
    local_c8.field_2._8_8_ = plVar2[3];
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar3;
    local_c8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_c8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((_Manager_type *)local_88._M_unused._0_8_ != &local_78) {
    operator_delete(local_88._M_unused._M_object,(ulong)(local_78 + 1));
  }
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_68,&(struct_def->fields).vec);
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"builder: FlatBufferBuilder","");
  local_78 = (_Manager_type)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x18);
  *(CodeWriter **)local_88._M_unused._0_8_ = writer;
  *(string **)((long)local_88._M_unused._0_8_ + 8) = &local_c8;
  *(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> **)
   ((long)local_88._M_unused._0_8_ + 0x10) = &local_68;
  pcStack_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:792:9)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:792:9)>
             ::_M_manager;
  GenerateFun(writer,&local_50,&local_a8,&local_c8,(function<void_()> *)&local_88,
              options->gen_jvmstatic);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateEndStructMethod(StructDef &struct_def, CodeWriter &writer,
                               const IDLOptions options) const {
    // Generate end{{TableName}}(builder: FlatBufferBuilder) method
    auto name = namer_.Method("end", struct_def.name);
    auto params = "builder: FlatBufferBuilder";
    auto returns = "Offset<" + namer_.Type(struct_def) + '>';
    auto field_vec = struct_def.fields.vec;

    GenerateFun(
        writer, name, params, returns,
        [&]() {
          writer += "val o: " + returns + " = builder.endTable()";
          writer.IncrementIdentLevel();
          for (auto it = field_vec.begin(); it != field_vec.end(); ++it) {
            auto &field = **it;
            if (field.deprecated || !field.IsRequired()) { continue; }
            writer.SetValue("offset", NumToString(field.value.offset));
            writer.SetValue("field_name", field.name);
            writer += "builder.required(o, {{offset}}, \"{{field_name}}\")";
          }
          writer.DecrementIdentLevel();
          writer += "return o";
        },
        options.gen_jvmstatic);
  }